

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O1

GlobalLogSinkSet * absl::lts_20250127::log_internal::anon_unknown_0::GlobalSinks(void)

{
  GlobalLogSinkSet *pGVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  undefined8 uVar3;
  NoDestructor<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet> *this;
  
  iVar2 = CONCAT31((int3)((uint)in_EAX >> 8),(anonymous_namespace)::GlobalSinks()::global_sinks);
  if ((anonymous_namespace)::GlobalSinks()::global_sinks == '\0') {
    this = (NoDestructor<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet>
            *)&(anonymous_namespace)::GlobalSinks()::global_sinks;
    uVar3 = __cxa_guard_acquire();
    in_register_00000004 = (undefined4)((ulong)uVar3 >> 0x20);
    iVar2 = (int)uVar3;
    if (iVar2 != 0) {
      NoDestructor<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet>::
      NoDestructor<0>(this);
      pGVar1 = (GlobalLogSinkSet *)
               __cxa_guard_release(&(anonymous_namespace)::GlobalSinks()::global_sinks);
      return pGVar1;
    }
  }
  return (GlobalLogSinkSet *)CONCAT44(in_register_00000004,iVar2);
}

Assistant:

GlobalLogSinkSet& GlobalSinks() {
  static absl::NoDestructor<GlobalLogSinkSet> global_sinks;
  return *global_sinks;
}